

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     )

{
  int iVar1;
  SrcList *pSVar2;
  sqlite3 *psVar3;
  Schema *pSVar4;
  Select *pSVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  Expr *pExpr_00;
  long lVar9;
  ulong uVar10;
  Schema **ppSVar11;
  int *piVar12;
  Table *pTVar13;
  long in_FS_OFFSET;
  bool bVar14;
  NameContext sNC;
  char *zOrigCol;
  char *zOrigTab;
  char *zOrigDb;
  undefined1 local_88 [40];
  undefined1 *puStack_60;
  Select *local_58;
  char *local_48;
  char *local_40;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar6 = (char *)0x0;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  if (pExpr->op == 0x8b) {
    local_88._8_8_ = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_001875e4:
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = pNC->pParse;
    local_88._24_8_ = pNC;
    pcVar6 = columnTypeImpl((NameContext *)local_88,pExpr_00,&local_38,&local_40,&local_48);
  }
  else {
    if (pExpr->op != 0xa8) goto LAB_00187664;
    if (pNC == (NameContext *)0x0) {
      bVar14 = true;
      pSVar5 = (Select *)0x0;
      pTVar13 = (Table *)0x0;
    }
    else {
      pTVar13 = (Table *)0x0;
      pSVar5 = (Select *)0x0;
      do {
        pSVar2 = pNC->pSrcList;
        uVar8 = (ulong)pSVar2->nSrc;
        bVar14 = 0 < (long)uVar8;
        if ((long)uVar8 < 1) {
LAB_00187589:
          pNC = pNC->pNext;
        }
        else {
          if (pSVar2->a[0].iCursor == pExpr->iTable) {
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            piVar12 = (int *)((long)&pSVar2[1].a[0].pSTab + 4);
            do {
              if (uVar8 - 1 == uVar10) goto LAB_00187589;
              uVar10 = uVar10 + 1;
              iVar1 = *piVar12;
              piVar12 = piVar12 + 0x12;
            } while (iVar1 != pExpr->iTable);
            bVar14 = uVar10 < uVar8;
          }
          if (!bVar14) goto LAB_00187589;
          pTVar13 = pSVar2->a[uVar10].pSTab;
          if ((pSVar2->a[uVar10].fg.field_0x1 & 4) == 0) {
            pSVar5 = (Select *)0x0;
          }
          else {
            pSVar5 = (pSVar2->a[uVar10].u4.pSubq)->pSelect;
          }
        }
        bVar14 = pTVar13 == (Table *)0x0;
      } while ((pNC != (NameContext *)0x0) && (pTVar13 == (Table *)0x0));
    }
    if (!bVar14) {
      uVar7 = (uint)pExpr->iColumn;
      if (pSVar5 == (Select *)0x0) {
        if (pExpr->iColumn < 0) {
          uVar7 = (uint)pTVar13->iPKey;
        }
        if ((int)uVar7 < 0) {
          local_48 = "rowid";
          pcVar6 = "INTEGER";
        }
        else {
          local_48 = pTVar13->aCol[uVar7].zCnName;
          pcVar6 = sqlite3ColumnType(pTVar13->aCol + uVar7,(char *)0x0);
        }
        local_40 = pTVar13->zName;
        if ((pNC->pParse != (Parse *)0x0) && (pTVar13->pSchema != (Schema *)0x0)) {
          psVar3 = pNC->pParse->db;
          lVar9 = -0x100000000;
          ppSVar11 = &psVar3->aDb->pSchema;
          do {
            lVar9 = lVar9 + 0x100000000;
            pSVar4 = *ppSVar11;
            ppSVar11 = ppSVar11 + 4;
          } while (pSVar4 != pTVar13->pSchema);
          local_38 = *(char **)((long)&psVar3->aDb->zDbSName + (lVar9 >> 0x1b));
        }
        goto LAB_00187664;
      }
      if ((int)uVar7 < pSVar5->pEList->nExpr) {
        local_88._8_8_ = pSVar5->pSrc;
        pExpr_00 = pSVar5->pEList->a[(int)uVar7].pExpr;
        goto LAB_001875e4;
      }
    }
    pcVar6 = (char *)0x0;
  }
LAB_00187664:
  if (pzOrigDb != (char **)0x0) {
    *pzOrigDb = local_38;
    *pzOrigTab = local_40;
    *pzOrigCol = local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pcVar6;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC,
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pSTab;
          if( pTabList->a[j].fg.isSubquery ){
            pS = pTabList->a[j].u4.pSubq->pSelect;
          }else{
            pS = 0;
          }
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && ExprUseYTab(pExpr) && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol<pS->pEList->nExpr
         && (!ViewCanHaveRowid || iCol>=0)
        ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol);
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zCnName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS;
      Expr *p;
      assert( ExprUseXSelect(pExpr) );
      pS = pExpr->x.pSelect;
      p = pS->pEList->a[0].pExpr;
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol);
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}